

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall
ON_PolylineCurve::IsContinuous
          (ON_PolylineCurve *this,continuity desired_continuity,double t,int *hint,
          double point_tolerance,double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int i_00;
  int iVar4;
  double *pdVar5;
  double dVar6;
  int local_f0;
  int local_a0;
  double segtol;
  int i;
  bool bPerformTest;
  int segment_count;
  bool rc;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  double d2_tolerance_local;
  double d1_tolerance_local;
  double point_tolerance_local;
  int *hint_local;
  double t_local;
  continuity desired_continuity_local;
  ON_PolylineCurve *this_local;
  
  bPerformTest = true;
  i_00 = ON_Polyline::SegmentCount(&this->m_pline);
  if (0 < i_00) {
    bVar3 = false;
    t_local._4_4_ = ON::PolylineContinuity(desired_continuity);
    pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,0);
    hint_local = (int *)t;
    if ((t <= *pdVar5) ||
       (pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,i_00), *pdVar5 <= t)) {
      if ((t_local._4_4_ - C0_locus_continuous < 2) || (t_local._4_4_ == G1_locus_continuous)) {
        bVar3 = true;
      }
    }
    else if ((1 < i_00) && (t_local._4_4_ != C0_continuous)) {
      iVar4 = PointCount(this);
      pdVar5 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
      if (hint == (int *)0x0) {
        local_a0 = 0;
      }
      else {
        local_a0 = *hint;
      }
      segtol._0_4_ = ON_NurbsSpanIndex(2,iVar4,pdVar5,t,0,local_a0);
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_);
      dVar1 = *pdVar5;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_ + 1);
      dVar6 = *pdVar5;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_ + 1);
      dVar2 = *pdVar5;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_);
      dVar6 = (ABS(dVar1) + ABS(dVar6) + ABS(dVar2 - *pdVar5)) * 1.490116119385e-08;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_);
      dVar1 = *pdVar5;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_ + 1);
      if (dVar1 + dVar6 < *pdVar5 - dVar6) {
        pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_);
        if ((dVar6 < ABS(t - *pdVar5)) || (segtol._0_4_ < 1)) {
          pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_ + 1);
          if ((ABS(t - *pdVar5) <= dVar6) && (iVar4 = PointCount(this), segtol._0_4_ + 1 < iVar4)) {
            pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_ + 1);
            hint_local = (int *)*pdVar5;
            iVar4 = PointCount(this);
            pdVar5 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
            if (hint == (int *)0x0) {
              local_f0 = 0;
            }
            else {
              local_f0 = *hint;
            }
            segtol._0_4_ = ON_NurbsSpanIndex(2,iVar4,pdVar5,(double)hint_local,0,local_f0);
          }
        }
        else {
          pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_);
          hint_local = (int *)*pdVar5;
        }
      }
      if (hint != (int *)0x0) {
        *hint = segtol._0_4_;
      }
      if ((0 < segtol._0_4_) && (segtol._0_4_ < i_00)) {
        pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._0_4_);
        if (((double)hint_local == *pdVar5) && (!NAN((double)hint_local) && !NAN(*pdVar5))) {
          t_local._4_4_ = ON::ParametricContinuity(t_local._4_4_);
          bVar3 = true;
        }
      }
    }
    if (bVar3) {
      bPerformTest = ON_Curve::IsContinuous
                               (&this->super_ON_Curve,t_local._4_4_,(double)hint_local,hint,
                                point_tolerance,d1_tolerance,d2_tolerance,cos_angle_tolerance,
                                curvature_tolerance);
    }
  }
  return bPerformTest;
}

Assistant:

bool ON_PolylineCurve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  bool rc = true;
  const int segment_count = m_pline.SegmentCount();

  if ( segment_count >= 1 )
  {
    bool bPerformTest = false;
    desired_continuity = ON::PolylineContinuity((int)desired_continuity);

    if ( t <= m_t[0] || t >= m_t[segment_count] )
    {
      // 20 March 2003 Dale Lear
      //     Consistently handles locus case and out of domain case.
      switch(desired_continuity)
      {
      case ON::continuity::C0_locus_continuous: 
      case ON::continuity::C1_locus_continuous: 
      case ON::continuity::G1_locus_continuous: 
        bPerformTest = true;
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
    }
    else
    {
      if ( segment_count >= 2 && desired_continuity != ON::continuity::C0_continuous ) 
      {
        int i = ON_NurbsSpanIndex(2,PointCount(),m_t,t,0,(hint)?*hint:0);
        
        {
          // 20 March 2003 Dale Lear:
          //     If t is very near interior m_t[] value, see if it
          //     should be set to that value.  A bit or two of 
          //     precision sometimes gets lost in proxy
          //     domain to real curve domain conversions on the interior
          //     of a curve domain.
          double segtol = (fabs(m_t[i]) + fabs(m_t[i+1]) + fabs(m_t[i+1]-m_t[i]))*ON_SQRT_EPSILON;
          if ( m_t[i]+segtol < m_t[i+1]-segtol )
          {
            if ( fabs(t-m_t[i]) <= segtol && i > 0 )
            {
              t = m_t[i];
            }
            else if ( fabs(t-m_t[i+1]) <= segtol && i+1 < PointCount() )
            {
              t = m_t[i+1];
              i = ON_NurbsSpanIndex(2,PointCount(),m_t,t,0,(hint)?*hint:0);
            }
          }
        }
        
        if ( hint )
          *hint = i;
        if ( i > 0 && i < segment_count && t == m_t[i] )
        {
          // "locus" and "parametric" tests are the same at this point.
          desired_continuity = ON::ParametricContinuity((int)desired_continuity);
          bPerformTest = true;
        }
      }
    }

    if ( bPerformTest )
    {
      // need to evaluate and test
      rc = ON_Curve::IsContinuous( desired_continuity, t, hint,
                                   point_tolerance, d1_tolerance, d2_tolerance,
                                   cos_angle_tolerance, curvature_tolerance );
    }
  }

  return rc;
}